

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestCase * __thiscall testing::UnitTest::current_test_case(UnitTest *this)

{
  TestCase *pTVar1;
  MutexLock lock;
  GTestMutexLock local_18;
  
  local_18.mutex_ = &(this->mutex_).super_MutexBase;
  internal::MutexBase::Lock(local_18.mutex_);
  pTVar1 = this->impl_->current_test_suite_;
  internal::GTestMutexLock::~GTestMutexLock(&local_18);
  return pTVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  return impl_->current_test_suite();
}